

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::Function::~Function(Function *this)

{
  Function *in_RDI;
  
  ~Function(in_RDI);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

virtual ~Function() = default;